

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

void __thiscall r_exec::_Fact::_Fact(_Fact *this,_Fact *f)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ushort local_2e;
  uint16_t i_1;
  ushort local_1a;
  uint16_t i;
  _Fact *f_local;
  _Fact *this_local;
  
  LObject::LObject(&this->super_LObject,(Mem *)0x0);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR___Fact_002eacc8;
  local_1a = 0;
  while( true ) {
    uVar1 = (*(f->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[6])();
    if ((uVar1 & 0xffff) <= (uint)local_1a) break;
    iVar2 = (*(f->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(f,(ulong)local_1a);
    iVar3 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,(ulong)local_1a);
    r_code::Atom::operator=
              ((Atom *)CONCAT44(extraout_var_00,iVar3),(Atom *)CONCAT44(extraout_var,iVar2));
    local_1a = local_1a + 1;
  }
  local_2e = 0;
  while( true ) {
    uVar1 = (*(f->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[10])();
    if ((uVar1 & 0xffff) <= (uint)local_2e) break;
    iVar2 = (*(f->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(f,(ulong)local_2e);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[0x19])(this,CONCAT44(extraout_var_01,iVar2));
    local_2e = local_2e + 1;
  }
  return;
}

Assistant:

_Fact::_Fact(_Fact *f)
{
    for (uint16_t i = 0; i < f->code_size(); ++i) {
        code(i) = f->code(i);
    }

    for (uint16_t i = 0; i < f->references_size(); ++i) {
        add_reference(f->get_reference(i));
    }
}